

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O0

void __thiscall LayoutFile::processWidget(LayoutFile *this,uint8_t *buf,Widget *widget)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  undefined4 extraout_var;
  Button *pBVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Label *pLVar5;
  undefined4 extraout_var_02;
  ImageBox *this_00;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ScrollPanel *pSVar6;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  TextField *pTVar7;
  undefined4 extraout_var_07;
  ProgressBar *this_01;
  undefined4 extraout_var_08;
  undefined8 uVar8;
  ProgressBar *local_140;
  ProgressBar *local_138;
  ProgressBar *local_130;
  ProgressBar *progressBar;
  TextField *local_120;
  TextField *local_118;
  TextField *textField;
  TextField *local_108;
  TextField *local_100;
  ListPanel *panel_3;
  ScrollPanel *local_f0;
  ScrollPanel *local_e8;
  ScrollPanel *panel_2;
  ScrollPanel *local_d8;
  ScrollPanel *local_d0;
  GridListPanel *panel_1;
  ImageBox *local_c0;
  ImageBox *imageBox;
  Label *local_b0;
  Label *local_a8;
  Label *label;
  Label *local_98;
  Label *local_90;
  Panel *panel;
  Button *local_80;
  Button *local_78;
  Button *button;
  Button *local_68;
  Button *local_60;
  BusyIndicator *bi;
  string local_48 [8];
  string name;
  int local_28;
  int local_24;
  int index;
  int i;
  Widget *widget_local;
  uint8_t *buf_local;
  LayoutFile *this_local;
  
  local_24 = 0;
  _index = widget;
  widget_local = (Widget *)buf;
  buf_local = (uint8_t *)this;
  do {
    if (_index->numChildren <= local_24) {
      return;
    }
    local_28 = 0;
    iVar2 = Util::readInt32((uint8_t *)widget_local,&local_28);
    widget_local = (Widget *)((long)&widget_local->_vptr_Widget + (long)iVar2);
    pvVar3 = std::vector<LayoutType,_std::allocator<LayoutType>_>::operator[]
                       (&this->types,(long)local_28);
    std::__cxx11::string::string(local_48,(string *)&pvVar3->name);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_48,"BusyIndicator");
    if (bVar1) {
      pBVar4 = (Button *)operator_new(0xb0);
      (pBVar4->super_Widget).transform.angleY = 0.0;
      (pBVar4->super_Widget).transform.angleZ = 0.0;
      *(undefined8 *)&pBVar4->textTrimming = 0;
      (pBVar4->super_Widget).transform.scaleX = 0.0;
      (pBVar4->super_Widget).transform.scaleY = 0.0;
      (pBVar4->super_Widget).transform.scaleZ = 0.0;
      (pBVar4->super_Widget).transform.angleX = 0.0;
      (pBVar4->super_Widget).anchor = AnchorNone;
      (pBVar4->super_Widget).transform.transX = 0.0;
      (pBVar4->super_Widget).transform.transY = 0.0;
      (pBVar4->super_Widget).transform.transZ = 0.0;
      *(undefined8 *)&(pBVar4->super_Widget).field_0x70 = 0;
      *(undefined8 *)&(pBVar4->super_Widget).field_0x78 = 0;
      *(undefined8 *)&(pBVar4->super_Widget).stylefile = 0;
      *(undefined8 *)&(pBVar4->super_Widget).field_0x68 = 0;
      *(undefined8 *)&(pBVar4->super_Widget).field_0x50 = 0;
      *(undefined8 *)&(pBVar4->super_Widget).field_0x58 = 0;
      *(undefined8 *)&(pBVar4->super_Widget).name = 0;
      *(undefined8 *)&(pBVar4->super_Widget).field_0x48 = 0;
      (pBVar4->super_Widget).y = 0.0;
      (pBVar4->super_Widget).width = 0.0;
      (pBVar4->super_Widget).height = 0.0;
      (pBVar4->super_Widget).visible = false;
      *(undefined3 *)&(pBVar4->super_Widget).field_0x3d = 0;
      (pBVar4->super_Widget).children.super__Vector_base<Widget_*,_std::allocator<Widget_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pBVar4->super_Widget).type = 0;
      (pBVar4->super_Widget).x = 0.0;
      (pBVar4->super_Widget).children.super__Vector_base<Widget_*,_std::allocator<Widget_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pBVar4->super_Widget).children.super__Vector_base<Widget_*,_std::allocator<Widget_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pBVar4->super_Widget)._vptr_Widget = (_func_int **)0x0;
      *(undefined8 *)&(pBVar4->super_Widget).numChildren = 0;
      BusyIndicator::BusyIndicator((BusyIndicator *)pBVar4);
      local_60 = pBVar4;
      iVar2 = (*(pBVar4->super_Widget)._vptr_Widget[1])(pBVar4,widget_local);
      widget_local = (Widget *)CONCAT44(extraout_var,iVar2);
      if (0 < (local_60->super_Widget).numChildren) {
        processWidget(this,(uint8_t *)widget_local,&local_60->super_Widget);
      }
      local_68 = local_60;
      std::vector<Widget_*,_std::allocator<Widget_*>_>::push_back
                (&_index->children,(value_type *)&local_68);
      button = local_60;
      std::vector<Widget_*,_std::allocator<Widget_*>_>::push_back
                (&this->widgets,(value_type *)&button);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_48,"Button");
      if (bVar1) {
        pBVar4 = (Button *)operator_new(0x1c8);
        memset(pBVar4,0,0x1c8);
        Button::Button(pBVar4);
        local_78 = pBVar4;
        iVar2 = (*(pBVar4->super_Widget)._vptr_Widget[1])(pBVar4,widget_local);
        widget_local = (Widget *)CONCAT44(extraout_var_00,iVar2);
        if (0 < (local_78->super_Widget).numChildren) {
          processWidget(this,(uint8_t *)widget_local,&local_78->super_Widget);
        }
        local_80 = local_78;
        std::vector<Widget_*,_std::allocator<Widget_*>_>::push_back
                  (&_index->children,(value_type *)&local_80);
        panel = (Panel *)local_78;
        std::vector<Widget_*,_std::allocator<Widget_*>_>::push_back
                  (&this->widgets,(value_type *)&panel);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_48,"Panel");
        if (bVar1) {
          pLVar5 = (Label *)operator_new(0xb8);
          (pLVar5->super_Widget).transform.angleY = 0.0;
          (pLVar5->super_Widget).transform.angleZ = 0.0;
          *(float *)&pLVar5->hasTextShadow = 0.0;
          pLVar5->topbaselineY = 0.0;
          (pLVar5->super_Widget).transform.scaleX = 0.0;
          (pLVar5->super_Widget).transform.scaleY = 0.0;
          (pLVar5->super_Widget).transform.scaleZ = 0.0;
          (pLVar5->super_Widget).transform.angleX = 0.0;
          (pLVar5->super_Widget).anchor = AnchorNone;
          (pLVar5->super_Widget).transform.transX = 0.0;
          (pLVar5->super_Widget).transform.transY = 0.0;
          (pLVar5->super_Widget).transform.transZ = 0.0;
          *(undefined8 *)&(pLVar5->super_Widget).field_0x70 = 0;
          *(undefined8 *)&(pLVar5->super_Widget).field_0x78 = 0;
          *(undefined8 *)&(pLVar5->super_Widget).stylefile = 0;
          *(undefined8 *)&(pLVar5->super_Widget).field_0x68 = 0;
          *(undefined8 *)&(pLVar5->super_Widget).field_0x50 = 0;
          *(undefined8 *)&(pLVar5->super_Widget).field_0x58 = 0;
          *(undefined8 *)&(pLVar5->super_Widget).name = 0;
          *(undefined8 *)&(pLVar5->super_Widget).field_0x48 = 0;
          (pLVar5->super_Widget).y = 0.0;
          (pLVar5->super_Widget).width = 0.0;
          (pLVar5->super_Widget).height = 0.0;
          (pLVar5->super_Widget).visible = false;
          *(undefined3 *)&(pLVar5->super_Widget).field_0x3d = 0;
          (pLVar5->super_Widget).children.super__Vector_base<Widget_*,_std::allocator<Widget_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (pLVar5->super_Widget).type = 0;
          (pLVar5->super_Widget).x = 0.0;
          (pLVar5->super_Widget).children.super__Vector_base<Widget_*,_std::allocator<Widget_*>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (pLVar5->super_Widget).children.super__Vector_base<Widget_*,_std::allocator<Widget_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (pLVar5->super_Widget)._vptr_Widget = (_func_int **)0x0;
          *(undefined8 *)&(pLVar5->super_Widget).numChildren = 0;
          *(undefined8 *)&pLVar5->text = 0;
          Panel::Panel((Panel *)pLVar5);
          local_90 = pLVar5;
          iVar2 = (*(pLVar5->super_Widget)._vptr_Widget[1])(pLVar5,widget_local);
          widget_local = (Widget *)CONCAT44(extraout_var_01,iVar2);
          if (0 < (local_90->super_Widget).numChildren) {
            processWidget(this,(uint8_t *)widget_local,&local_90->super_Widget);
          }
          local_98 = local_90;
          std::vector<Widget_*,_std::allocator<Widget_*>_>::push_back
                    (&_index->children,(value_type *)&local_98);
          label = local_90;
          std::vector<Widget_*,_std::allocator<Widget_*>_>::push_back
                    (&this->widgets,(value_type *)&label);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_48,"Label");
          if (bVar1) {
            pLVar5 = (Label *)operator_new(0x138);
            memset(pLVar5,0,0x138);
            Label::Label(pLVar5);
            local_a8 = pLVar5;
            iVar2 = (*(pLVar5->super_Widget)._vptr_Widget[1])(pLVar5,widget_local);
            widget_local = (Widget *)CONCAT44(extraout_var_02,iVar2);
            if (0 < (local_a8->super_Widget).numChildren) {
              processWidget(this,(uint8_t *)widget_local,&local_a8->super_Widget);
            }
            local_b0 = local_a8;
            std::vector<Widget_*,_std::allocator<Widget_*>_>::push_back
                      (&_index->children,(value_type *)&local_b0);
            imageBox = (ImageBox *)local_a8;
            std::vector<Widget_*,_std::allocator<Widget_*>_>::push_back
                      (&this->widgets,(value_type *)&imageBox);
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_48,"ImageBox");
            if (bVar1) {
              this_00 = (ImageBox *)operator_new(0xe0);
              (this_00->ninePatchMargin).bottom = 0;
              (this_00->ninePatchMargin).left = 0;
              *(undefined8 *)&(this_00->ninePatchMargin).right = 0;
              *(undefined8 *)&this_00->field_0xc0 = 0;
              this_00->imageScaleType = ScaleCenter;
              (this_00->ninePatchMargin).top = 0;
              *(undefined8 *)&this_00->field_0xb0 = 0;
              *(undefined8 *)&this_00->field_0xb8 = 0;
              (this_00->super_Widget).transform.angleY = 0.0;
              (this_00->super_Widget).transform.angleZ = 0.0;
              *(undefined8 *)&this_00->image = 0;
              (this_00->super_Widget).transform.scaleX = 0.0;
              (this_00->super_Widget).transform.scaleY = 0.0;
              (this_00->super_Widget).transform.scaleZ = 0.0;
              (this_00->super_Widget).transform.angleX = 0.0;
              (this_00->super_Widget).anchor = AnchorNone;
              (this_00->super_Widget).transform.transX = 0.0;
              (this_00->super_Widget).transform.transY = 0.0;
              (this_00->super_Widget).transform.transZ = 0.0;
              *(undefined8 *)&(this_00->super_Widget).field_0x70 = 0;
              *(undefined8 *)&(this_00->super_Widget).field_0x78 = 0;
              *(undefined8 *)&(this_00->super_Widget).stylefile = 0;
              *(undefined8 *)&(this_00->super_Widget).field_0x68 = 0;
              *(undefined8 *)&(this_00->super_Widget).field_0x50 = 0;
              *(undefined8 *)&(this_00->super_Widget).field_0x58 = 0;
              *(undefined8 *)&(this_00->super_Widget).name = 0;
              *(undefined8 *)&(this_00->super_Widget).field_0x48 = 0;
              (this_00->super_Widget).y = 0.0;
              (this_00->super_Widget).width = 0.0;
              (this_00->super_Widget).height = 0.0;
              (this_00->super_Widget).visible = false;
              *(undefined3 *)&(this_00->super_Widget).field_0x3d = 0;
              (this_00->super_Widget).children.
              super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              (this_00->super_Widget).type = 0;
              (this_00->super_Widget).x = 0.0;
              (this_00->super_Widget).children.
              super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              (this_00->super_Widget).children.
              super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              (this_00->super_Widget)._vptr_Widget = (_func_int **)0x0;
              *(undefined8 *)&(this_00->super_Widget).numChildren = 0;
              ImageBox::ImageBox(this_00);
              local_c0 = this_00;
              iVar2 = (*(this_00->super_Widget)._vptr_Widget[1])(this_00,widget_local);
              widget_local = (Widget *)CONCAT44(extraout_var_03,iVar2);
              if (0 < (local_c0->super_Widget).numChildren) {
                processWidget(this,(uint8_t *)widget_local,&local_c0->super_Widget);
              }
              panel_1 = (GridListPanel *)local_c0;
              std::vector<Widget_*,_std::allocator<Widget_*>_>::push_back
                        (&_index->children,(value_type *)&panel_1);
              std::vector<Widget_*,_std::allocator<Widget_*>_>::push_back
                        (&this->widgets,(value_type *)&index);
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_48,"GridListPanel");
              if (bVar1) {
                pSVar6 = (ScrollPanel *)operator_new(0xd8);
                *(undefined8 *)&pSVar6->panelName = 0;
                *(undefined8 *)&pSVar6->field_0xc8 = 0;
                *(undefined8 *)&pSVar6->panelY = 0;
                *(undefined8 *)&pSVar6->panelHeight = 0;
                (pSVar6->super_Widget).transform.angleY = 0.0;
                (pSVar6->super_Widget).transform.angleZ = 0.0;
                *(undefined8 *)&pSVar6->horizontalScroll = 0;
                (pSVar6->super_Widget).transform.scaleX = 0.0;
                (pSVar6->super_Widget).transform.scaleY = 0.0;
                (pSVar6->super_Widget).transform.scaleZ = 0.0;
                (pSVar6->super_Widget).transform.angleX = 0.0;
                (pSVar6->super_Widget).anchor = AnchorNone;
                (pSVar6->super_Widget).transform.transX = 0.0;
                (pSVar6->super_Widget).transform.transY = 0.0;
                (pSVar6->super_Widget).transform.transZ = 0.0;
                *(undefined8 *)&(pSVar6->super_Widget).field_0x70 = 0;
                *(undefined8 *)&(pSVar6->super_Widget).field_0x78 = 0;
                *(undefined8 *)&(pSVar6->super_Widget).stylefile = 0;
                *(undefined8 *)&(pSVar6->super_Widget).field_0x68 = 0;
                *(undefined8 *)&(pSVar6->super_Widget).field_0x50 = 0;
                *(undefined8 *)&(pSVar6->super_Widget).field_0x58 = 0;
                *(undefined8 *)&(pSVar6->super_Widget).name = 0;
                *(undefined8 *)&(pSVar6->super_Widget).field_0x48 = 0;
                (pSVar6->super_Widget).y = 0.0;
                (pSVar6->super_Widget).width = 0.0;
                (pSVar6->super_Widget).height = 0.0;
                (pSVar6->super_Widget).visible = false;
                *(undefined3 *)&(pSVar6->super_Widget).field_0x3d = 0;
                (pSVar6->super_Widget).children.
                super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                (pSVar6->super_Widget).type = 0;
                (pSVar6->super_Widget).x = 0.0;
                (pSVar6->super_Widget).children.
                super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                (pSVar6->super_Widget).children.
                super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                (pSVar6->super_Widget)._vptr_Widget = (_func_int **)0x0;
                *(undefined8 *)&(pSVar6->super_Widget).numChildren = 0;
                *(undefined8 *)&pSVar6->field_0xd0 = 0;
                GridListPanel::GridListPanel((GridListPanel *)pSVar6);
                local_d0 = pSVar6;
                iVar2 = (*(pSVar6->super_Widget)._vptr_Widget[1])(pSVar6,widget_local);
                widget_local = (Widget *)CONCAT44(extraout_var_04,iVar2);
                if (0 < (local_d0->super_Widget).numChildren) {
                  processWidget(this,(uint8_t *)widget_local,&local_d0->super_Widget);
                }
                local_d8 = local_d0;
                std::vector<Widget_*,_std::allocator<Widget_*>_>::push_back
                          (&_index->children,(value_type *)&local_d8);
                panel_2 = local_d0;
                std::vector<Widget_*,_std::allocator<Widget_*>_>::push_back
                          (&this->widgets,(value_type *)&panel_2);
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_48,"ScrollPanel");
                if (bVar1) {
                  pSVar6 = (ScrollPanel *)operator_new(0xe8);
                  *(undefined8 *)&pSVar6->field_0xd0 = 0;
                  *(undefined8 *)&pSVar6->field_0xd8 = 0;
                  *(undefined8 *)&pSVar6->panelName = 0;
                  *(undefined8 *)&pSVar6->field_0xc8 = 0;
                  pSVar6->panelY = 0.0;
                  pSVar6->panelWidth = 0.0;
                  *(undefined8 *)&pSVar6->panelHeight = 0;
                  (pSVar6->super_Widget).transform.angleY = 0.0;
                  (pSVar6->super_Widget).transform.angleZ = 0.0;
                  pSVar6->horizontalScroll = false;
                  pSVar6->verticalScroll = false;
                  *(undefined2 *)&pSVar6->field_0xaa = 0;
                  pSVar6->panelX = 0.0;
                  (pSVar6->super_Widget).transform.scaleX = 0.0;
                  (pSVar6->super_Widget).transform.scaleY = 0.0;
                  (pSVar6->super_Widget).transform.scaleZ = 0.0;
                  (pSVar6->super_Widget).transform.angleX = 0.0;
                  (pSVar6->super_Widget).anchor = AnchorNone;
                  (pSVar6->super_Widget).transform.transX = 0.0;
                  (pSVar6->super_Widget).transform.transY = 0.0;
                  (pSVar6->super_Widget).transform.transZ = 0.0;
                  *(undefined8 *)&(pSVar6->super_Widget).field_0x70 = 0;
                  *(undefined8 *)&(pSVar6->super_Widget).field_0x78 = 0;
                  *(undefined8 *)&(pSVar6->super_Widget).stylefile = 0;
                  *(undefined8 *)&(pSVar6->super_Widget).field_0x68 = 0;
                  *(undefined8 *)&(pSVar6->super_Widget).field_0x50 = 0;
                  *(undefined8 *)&(pSVar6->super_Widget).field_0x58 = 0;
                  *(undefined8 *)&(pSVar6->super_Widget).name = 0;
                  *(undefined8 *)&(pSVar6->super_Widget).field_0x48 = 0;
                  (pSVar6->super_Widget).y = 0.0;
                  (pSVar6->super_Widget).width = 0.0;
                  (pSVar6->super_Widget).height = 0.0;
                  (pSVar6->super_Widget).visible = false;
                  *(undefined3 *)&(pSVar6->super_Widget).field_0x3d = 0;
                  (pSVar6->super_Widget).children.
                  super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  (pSVar6->super_Widget).type = 0;
                  (pSVar6->super_Widget).x = 0.0;
                  (pSVar6->super_Widget).children.
                  super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  (pSVar6->super_Widget).children.
                  super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  (pSVar6->super_Widget)._vptr_Widget = (_func_int **)0x0;
                  *(undefined8 *)&(pSVar6->super_Widget).numChildren = 0;
                  *(undefined8 *)&pSVar6->scrollBarVisibility = 0;
                  ScrollPanel::ScrollPanel(pSVar6);
                  local_e8 = pSVar6;
                  iVar2 = (*(pSVar6->super_Widget)._vptr_Widget[1])(pSVar6,widget_local);
                  widget_local = (Widget *)CONCAT44(extraout_var_05,iVar2);
                  if (0 < (local_e8->super_Widget).numChildren) {
                    processWidget(this,(uint8_t *)widget_local,&local_e8->super_Widget);
                  }
                  local_f0 = local_e8;
                  std::vector<Widget_*,_std::allocator<Widget_*>_>::push_back
                            (&_index->children,(value_type *)&local_f0);
                  panel_3 = (ListPanel *)local_e8;
                  std::vector<Widget_*,_std::allocator<Widget_*>_>::push_back
                            (&this->widgets,(value_type *)&panel_3);
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_48,"ListPanel");
                  if (bVar1) {
                    pTVar7 = (TextField *)operator_new(0xd8);
                    *(undefined8 *)&pTVar7->field_0xc0 = 0;
                    *(undefined8 *)&pTVar7->field_0xc8 = 0;
                    *(undefined8 *)&pTVar7->imeWindowMode = 0;
                    *(undefined8 *)&pTVar7->imeWindowTitle = 0;
                    (pTVar7->super_Widget).transform.angleY = 0.0;
                    (pTVar7->super_Widget).transform.angleZ = 0.0;
                    *(undefined8 *)&pTVar7->passwordMode = 0;
                    (pTVar7->super_Widget).transform.scaleX = 0.0;
                    (pTVar7->super_Widget).transform.scaleY = 0.0;
                    (pTVar7->super_Widget).transform.scaleZ = 0.0;
                    (pTVar7->super_Widget).transform.angleX = 0.0;
                    (pTVar7->super_Widget).anchor = AnchorNone;
                    (pTVar7->super_Widget).transform.transX = 0.0;
                    (pTVar7->super_Widget).transform.transY = 0.0;
                    (pTVar7->super_Widget).transform.transZ = 0.0;
                    *(undefined8 *)&(pTVar7->super_Widget).field_0x70 = 0;
                    *(undefined8 *)&(pTVar7->super_Widget).field_0x78 = 0;
                    *(undefined8 *)&(pTVar7->super_Widget).stylefile = 0;
                    *(undefined8 *)&(pTVar7->super_Widget).field_0x68 = 0;
                    *(undefined8 *)&(pTVar7->super_Widget).field_0x50 = 0;
                    *(undefined8 *)&(pTVar7->super_Widget).field_0x58 = 0;
                    *(undefined8 *)&(pTVar7->super_Widget).name = 0;
                    *(undefined8 *)&(pTVar7->super_Widget).field_0x48 = 0;
                    (pTVar7->super_Widget).y = 0.0;
                    (pTVar7->super_Widget).width = 0.0;
                    (pTVar7->super_Widget).height = 0.0;
                    (pTVar7->super_Widget).visible = false;
                    *(undefined3 *)&(pTVar7->super_Widget).field_0x3d = 0;
                    (pTVar7->super_Widget).children.
                    super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    (pTVar7->super_Widget).type = 0;
                    (pTVar7->super_Widget).x = 0.0;
                    (pTVar7->super_Widget).children.
                    super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                    super__Vector_impl_data._M_start = (pointer)0x0;
                    (pTVar7->super_Widget).children.
                    super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                    super__Vector_impl_data._M_finish = (pointer)0x0;
                    (pTVar7->super_Widget)._vptr_Widget = (_func_int **)0x0;
                    *(undefined8 *)&(pTVar7->super_Widget).numChildren = 0;
                    *(undefined8 *)&pTVar7->field_0xd0 = 0;
                    ListPanel::ListPanel((ListPanel *)pTVar7);
                    local_100 = pTVar7;
                    iVar2 = (*(pTVar7->super_Widget)._vptr_Widget[1])(pTVar7,widget_local);
                    widget_local = (Widget *)CONCAT44(extraout_var_06,iVar2);
                    if (0 < (local_100->super_Widget).numChildren) {
                      processWidget(this,(uint8_t *)widget_local,&local_100->super_Widget);
                    }
                    local_108 = local_100;
                    std::vector<Widget_*,_std::allocator<Widget_*>_>::push_back
                              (&_index->children,(value_type *)&local_108);
                    textField = local_100;
                    std::vector<Widget_*,_std::allocator<Widget_*>_>::push_back
                              (&this->widgets,(value_type *)&textField);
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_48,"TextField");
                    if (bVar1) {
                      pTVar7 = (TextField *)operator_new(0x1a8);
                      memset(pTVar7,0,0x1a8);
                      TextField::TextField(pTVar7);
                      local_118 = pTVar7;
                      iVar2 = (*(pTVar7->super_Widget)._vptr_Widget[1])(pTVar7,widget_local);
                      widget_local = (Widget *)CONCAT44(extraout_var_07,iVar2);
                      if (0 < (local_118->super_Widget).numChildren) {
                        processWidget(this,(uint8_t *)widget_local,&local_118->super_Widget);
                      }
                      local_120 = local_118;
                      std::vector<Widget_*,_std::allocator<Widget_*>_>::push_back
                                (&_index->children,(value_type *)&local_120);
                      progressBar = (ProgressBar *)local_118;
                      std::vector<Widget_*,_std::allocator<Widget_*>_>::push_back
                                (&this->widgets,(value_type *)&progressBar);
                    }
                    else {
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_48,"ProgressBar");
                      if (!bVar1) {
                        uVar8 = std::__cxx11::string::c_str();
                        printf("UNSUPPORTED TYPE! [%s]\n",uVar8);
                        exit(1);
                      }
                      this_01 = (ProgressBar *)operator_new(0xb0);
                      (this_01->super_Widget).transform.angleY = 0.0;
                      (this_01->super_Widget).transform.angleZ = 0.0;
                      this_01->progressBarType = BarNormal;
                      this_01->progress = 0.0;
                      (this_01->super_Widget).transform.scaleX = 0.0;
                      (this_01->super_Widget).transform.scaleY = 0.0;
                      (this_01->super_Widget).transform.scaleZ = 0.0;
                      (this_01->super_Widget).transform.angleX = 0.0;
                      (this_01->super_Widget).anchor = AnchorNone;
                      (this_01->super_Widget).transform.transX = 0.0;
                      (this_01->super_Widget).transform.transY = 0.0;
                      (this_01->super_Widget).transform.transZ = 0.0;
                      *(undefined8 *)&(this_01->super_Widget).field_0x70 = 0;
                      *(undefined8 *)&(this_01->super_Widget).field_0x78 = 0;
                      *(undefined8 *)&(this_01->super_Widget).stylefile = 0;
                      *(undefined8 *)&(this_01->super_Widget).field_0x68 = 0;
                      *(undefined8 *)&(this_01->super_Widget).field_0x50 = 0;
                      *(undefined8 *)&(this_01->super_Widget).field_0x58 = 0;
                      *(undefined8 *)&(this_01->super_Widget).name = 0;
                      *(undefined8 *)&(this_01->super_Widget).field_0x48 = 0;
                      (this_01->super_Widget).y = 0.0;
                      (this_01->super_Widget).width = 0.0;
                      (this_01->super_Widget).height = 0.0;
                      (this_01->super_Widget).visible = false;
                      *(undefined3 *)&(this_01->super_Widget).field_0x3d = 0;
                      (this_01->super_Widget).children.
                      super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                      (this_01->super_Widget).type = 0;
                      (this_01->super_Widget).x = 0.0;
                      (this_01->super_Widget).children.
                      super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                      super__Vector_impl_data._M_start = (pointer)0x0;
                      (this_01->super_Widget).children.
                      super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                      super__Vector_impl_data._M_finish = (pointer)0x0;
                      (this_01->super_Widget)._vptr_Widget = (_func_int **)0x0;
                      *(undefined8 *)&(this_01->super_Widget).numChildren = 0;
                      ProgressBar::ProgressBar(this_01);
                      local_130 = this_01;
                      iVar2 = (*(this_01->super_Widget)._vptr_Widget[1])(this_01,widget_local);
                      widget_local = (Widget *)CONCAT44(extraout_var_08,iVar2);
                      local_138 = local_130;
                      std::vector<Widget_*,_std::allocator<Widget_*>_>::push_back
                                (&_index->children,(value_type *)&local_138);
                      local_140 = local_130;
                      std::vector<Widget_*,_std::allocator<Widget_*>_>::push_back
                                (&this->widgets,(value_type *)&local_140);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string(local_48);
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

void LayoutFile::processWidget(uint8_t* buf, Widget *widget)
{
	for (int i = 0; i < widget->numChildren; i++)
	{
		int index = 0;
		buf += Util::readInt32(buf, index);

		std::string name = types[index].name;

		if (name == "BusyIndicator")
		{
			BusyIndicator *bi = new BusyIndicator();
			buf = bi->read(buf);
			
			if (bi->numChildren > 0)
				processWidget(buf, bi);

			widget->children.push_back(bi);
			widgets.push_back(bi);
		}
		else if (name == "Button")
		{
			Button *button = new Button();
			buf = button->read(buf);

			if (button->numChildren > 0)
				processWidget(buf, button);

			widget->children.push_back(button);
			widgets.push_back(button);
		}
		else if (name == "Panel")
		{
			Panel *panel = new Panel();
			buf = panel->read(buf);

			if (panel->numChildren > 0)
				processWidget(buf, panel);

			widget->children.push_back(panel);
			widgets.push_back(panel);
		}
		else if (name == "Label")
		{
			Label *label = new Label();
			buf = label->read(buf);

			if (label->numChildren > 0)
				processWidget(buf, label);

			widget->children.push_back(label);
			widgets.push_back(label);
		}
		else if (name == "ImageBox")
		{
			ImageBox *imageBox = new ImageBox();
			buf = imageBox->read(buf);

			if (imageBox->numChildren > 0)
			{
				processWidget(buf, imageBox);
			}

			widget->children.push_back(imageBox);
			widgets.push_back(widget);
		}
		else if (name == "GridListPanel")
		{
			GridListPanel *panel = new GridListPanel();
			buf = panel->read(buf);

			if (panel->numChildren > 0)
				processWidget(buf, panel);

			widget->children.push_back(panel);
			widgets.push_back(panel);
		}
		else if (name == "ScrollPanel")
		{
			ScrollPanel *panel = new ScrollPanel();
			buf = panel->read(buf);

			if (panel->numChildren > 0)
				processWidget(buf, panel);

			widget->children.push_back(panel);
			widgets.push_back(panel);
		}
		else if (name == "ListPanel")
		{
			ListPanel *panel = new ListPanel();
			buf = panel->read(buf);

			if (panel->numChildren > 0)
				processWidget(buf, panel);

			widget->children.push_back(panel);
			widgets.push_back(panel);
		}
		else if (name == "TextField")
		{
			TextField *textField = new TextField();
			buf = textField->read(buf);

			if (textField->numChildren > 0)
				processWidget(buf, textField);

			widget->children.push_back(textField);
			widgets.push_back(textField);
		}
		else if (name == "ProgressBar")
		{
			ProgressBar *progressBar = new ProgressBar();
			buf = progressBar->read(buf);

			widget->children.push_back(progressBar);
			widgets.push_back(progressBar);
		}
		else
		{
			printf("UNSUPPORTED TYPE! [%s]\n", name.c_str());
			exit(1);
		}
	}
}